

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::RegistryHub::registerTest
          (RegistryHub *this,unique_ptr<Catch::TestCaseInfo> *testInfo,
          unique_ptr<Catch::ITestInvoker> *invoker)

{
  unique_ptr<Catch::ITestInvoker> *in_RDX;
  unique_ptr<Catch::TestCaseInfo> *in_RSI;
  unique_ptr<Catch::TestCaseInfo> *in_RDI;
  TestRegistry *unaff_retaddr;
  unique_ptr<Catch::TestCaseInfo> *this_00;
  unique_ptr<Catch::ITestInvoker> local_28;
  unique_ptr<Catch::TestCaseInfo> local_20;
  unique_ptr<Catch::ITestInvoker> *local_18;
  
  this_00 = in_RDI + 2;
  local_18 = in_RDX;
  Detail::unique_ptr<Catch::TestCaseInfo>::unique_ptr(&local_20,in_RSI);
  Detail::unique_ptr<Catch::ITestInvoker>::unique_ptr(&local_28,local_18);
  TestRegistry::registerTest(unaff_retaddr,in_RDI,(unique_ptr<Catch::ITestInvoker> *)in_RSI);
  Detail::unique_ptr<Catch::ITestInvoker>::~unique_ptr((unique_ptr<Catch::ITestInvoker> *)this_00);
  Detail::unique_ptr<Catch::TestCaseInfo>::~unique_ptr(this_00);
  return;
}

Assistant:

void registerTest( Detail::unique_ptr<TestCaseInfo>&& testInfo, Detail::unique_ptr<ITestInvoker>&& invoker ) override {
                m_testCaseRegistry.registerTest( CATCH_MOVE(testInfo), CATCH_MOVE(invoker) );
            }